

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O2

void __thiscall SQFile::~SQFile(SQFile *this)

{
  ~SQFile(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~SQFile() { Close(); }